

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O1

void __thiscall DStrobe::Tick(DStrobe *this)

{
  sector_t_conflict *psVar1;
  int *piVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  
  piVar2 = &this->m_Count;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 != 0) {
    return;
  }
  psVar1 = (this->super_DLighting).super_DSectorEffect.m_Sector;
  iVar4 = this->m_MinLight;
  if (iVar4 == psVar1->lightlevel) {
    iVar4 = 0x7fff;
    if (this->m_MaxLight < 0x7fff) {
      iVar4 = this->m_MaxLight;
    }
    sVar3 = -0x8000;
    if (-0x8000 < iVar4) {
      sVar3 = (short)iVar4;
    }
    psVar1->lightlevel = sVar3;
    piVar2 = &this->m_BrightTime;
  }
  else {
    iVar5 = 0x7fff;
    if (iVar4 < 0x7fff) {
      iVar5 = iVar4;
    }
    sVar3 = -0x8000;
    if (-0x8000 < iVar5) {
      sVar3 = (short)iVar5;
    }
    psVar1->lightlevel = sVar3;
    piVar2 = &this->m_DarkTime;
  }
  this->m_Count = *piVar2;
  return;
}

Assistant:

void DStrobe::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MinLight)
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = m_BrightTime;
		}
		else
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = m_DarkTime;
		}
	}
}